

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_quaternion_op.hpp
# Opt level: O3

quaternion<double> * HAXX::operator*(quaternion<double> *__x,quaternion<double> *__y)

{
  double dVar1;
  quaternion<double> qVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  quaternion<double> *in_RDI;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  qVar2 = *__x;
  auVar4._0_8_ = __y->_M_real;
  auVar4._8_8_ = __y->_M_imag_i;
  auVar8._0_8_ = __y->_M_imag_j;
  auVar8._8_8_ = __y->_M_imag_k;
  auVar10 = vpermpd_avx2((undefined1  [32])*__y,1);
  auVar9 = vshufpd_avx((undefined1  [32])qVar2,(undefined1  [32])qVar2,0xb);
  auVar6 = vpermpd_avx2((undefined1  [32])qVar2,0x7a);
  auVar7 = vpermpd_avx2((undefined1  [32])qVar2,0x9f);
  auVar11._0_8_ = auVar9._0_8_ * auVar10._0_8_;
  auVar11._8_8_ = auVar9._8_8_ * auVar10._8_8_;
  auVar11._16_8_ = auVar9._16_8_ * auVar10._16_8_;
  auVar11._24_8_ = auVar9._24_8_ * auVar10._24_8_;
  auVar3 = vshufpd_avx(auVar4,auVar8,1);
  auVar5 = vunpckhpd_avx(auVar8,auVar4);
  auVar12._16_16_ = auVar3;
  auVar12._0_16_ = auVar8;
  auVar4 = vshufpd_avx(auVar8,auVar8,1);
  auVar8 = vfmadd213pd_fma(auVar12,auVar6,auVar11);
  auVar10._0_8_ = auVar4._0_8_ * auVar7._0_8_;
  auVar10._8_8_ = auVar4._8_8_ * auVar7._8_8_;
  auVar10._16_8_ = auVar5._0_8_ * auVar7._16_8_;
  auVar10._24_8_ = auVar5._8_8_ * auVar7._24_8_;
  dVar1 = __x->_M_real;
  auVar9._8_8_ = dVar1;
  auVar9._0_8_ = dVar1;
  auVar9._16_8_ = dVar1;
  auVar9._24_8_ = dVar1;
  auVar9 = vfmsub231pd_avx512vl(auVar10,(undefined1  [32])*__y,auVar9);
  in_RDI->_M_real = auVar9._0_8_ + -auVar8._0_8_;
  in_RDI->_M_imag_i = auVar9._8_8_ + auVar8._8_8_;
  in_RDI->_M_imag_j = auVar9._16_8_ + 0.0;
  in_RDI->_M_imag_k = auVar9._24_8_ + 0.0;
  return in_RDI;
}

Assistant:

inline quaternion<double> operator*(const quaternion<double>& __x,
    const quaternion<double>& __y) {
  
    quaternion<double> __r;
  
    // Load x,y into 256-bit vector lanes and perform the multiplication
    __m256d x = LOAD_256D_UNALIGNED_AS(double,&__x);
    __m256d y = LOAD_256D_UNALIGNED_AS(double,&__y);
    __m256d r = MULDQ_NN(x,y);
  
    STORE_256D_UNALIGNED_AS(double,&__r,r);
    
    return __r;
  }